

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_MP.h
# Opt level: O0

void __thiscall
BGIP_SolverCreator_MP<JointPolicyPureVector>::BGIP_SolverCreator_MP
          (BGIP_SolverCreator_MP<JointPolicyPureVector> *this,size_t maxiter,string *updateT,
          size_t verbose,double damping,size_t nrSolutions,size_t nrRestarts)

{
  _func_int **in_RCX;
  string *in_RDX;
  _func_int **in_RSI;
  BGIP_SolverCreatorInterface_T<JointPolicyPureVector> *in_RDI;
  _func_int **in_R8;
  _func_int **in_R9;
  
  BGIP_SolverCreatorInterface_T<JointPolicyPureVector>::BGIP_SolverCreatorInterface_T(in_RDI);
  (in_RDI->super_BGIP_SolverCreatorInterface)._vptr_BGIP_SolverCreatorInterface =
       (_func_int **)&PTR__BGIP_SolverCreator_MP_0016ca08;
  in_RDI[1].super_BGIP_SolverCreatorInterface._vptr_BGIP_SolverCreatorInterface = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RDX);
  in_RDI[6].super_BGIP_SolverCreatorInterface._vptr_BGIP_SolverCreatorInterface = in_RCX;
  in_RDI[8].super_BGIP_SolverCreatorInterface._vptr_BGIP_SolverCreatorInterface = in_R8;
  in_RDI[9].super_BGIP_SolverCreatorInterface._vptr_BGIP_SolverCreatorInterface = in_R9;
  return;
}

Assistant:

BGIP_SolverCreator_MP( size_t maxiter =25,
                           const std::string & updateT = std::string("PARALL"),
                           size_t verbose=1,
                           double damping=0.0,
                           size_t nrSolutions=1,
                           size_t nrRestarts=10 
        )
        :
        _m_maxiter(maxiter),
        _m_updateType(updateT),
        _m_verbose(verbose),
        _m_nrSolutions(nrSolutions),
        _m_nrRestarts(nrRestarts)        
        {}